

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::load_entries<setup::ini_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::ini_entry,_std::allocator<setup::ini_entry>_> *result,enum_type entry_type)

{
  registry_entry *this_00;
  _Base_bitset<1UL> _Var1;
  long lVar2;
  bool bVar3;
  ini_entry entry;
  flags<setup::info::entry_types_Enum_,_21UL> local_1c0 [50];
  
  local_1c0[0]._flags.super__Base_bitset<1UL>._M_w = entries._flags.super__Base_bitset<1UL>._M_w;
  std::vector<setup::ini_entry,_std::allocator<setup::ini_entry>_>::clear(result);
  _Var1._M_w = (_WordT)flags<setup::info::entry_types_Enum_,_21UL>::operator&(local_1c0,entry_type);
  if ((_Base_bitset<1UL>)_Var1._M_w == (_Base_bitset<1UL>)0x0) {
    this_00 = (registry_entry *)(local_1c0 + 1);
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      ini_entry::ini_entry((ini_entry *)this_00);
      ini_entry::load((ini_entry *)this_00,is,this);
      registry_entry::~registry_entry(this_00);
    }
  }
  else {
    std::vector<setup::ini_entry,_std::allocator<setup::ini_entry>_>::resize(result,count);
    lVar2 = 0;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      ini_entry::load((ini_entry *)
                      ((long)&(((result->
                                super__Vector_base<setup::ini_entry,_std::allocator<setup::ini_entry>_>
                                )._M_impl.super__Vector_impl_data._M_start)->super_item).components.
                              _M_dataplus + lVar2),is,this);
      lVar2 = lVar2 + 0x188;
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}